

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCheatSheetTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheatSheet_bar_TestShell::~TEST_MockCheatSheet_bar_TestShell
          (TEST_MockCheatSheet_bar_TestShell *this)

{
  TEST_MockCheatSheet_bar_TestShell *this_local;
  
  ~TEST_MockCheatSheet_bar_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCheatSheet, bar)
{
    /* Expect 2 calls on Bar. Check only one parameter */
    mock().expectNCalls(2, "Bar")
        .withParameter("param_double", 1.5)
        .ignoreOtherParameters();

    /* And the production code call */
    productionCodeBarCalls();
}